

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fixExprCb(Walker *p,Expr *pExpr)

{
  DbFixer *pDVar1;
  DbFixer *pFix;
  Expr *pExpr_local;
  Walker *p_local;
  
  pDVar1 = (p->u).pFix;
  if (pDVar1->bTemp == '\0') {
    pExpr->flags = pExpr->flags | 0x40000000;
  }
  if (pExpr->op == 0x9c) {
    if ((pDVar1->pParse->db->init).busy == '\0') {
      sqlite3ErrorMsg(pDVar1->pParse,"%s cannot use variables",pDVar1->zType);
      return 2;
    }
    pExpr->op = 'y';
  }
  return 0;
}

Assistant:

static int fixExprCb(Walker *p, Expr *pExpr){
  DbFixer *pFix = p->u.pFix;
  if( !pFix->bTemp ) ExprSetProperty(pExpr, EP_FromDDL);
  if( pExpr->op==TK_VARIABLE ){
    if( pFix->pParse->db->init.busy ){
      pExpr->op = TK_NULL;
    }else{
      sqlite3ErrorMsg(pFix->pParse, "%s cannot use variables", pFix->zType);
      return WRC_Abort;
    }
  }
  return WRC_Continue;
}